

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

symbolEncodingType_e
ZSTD_selectEncodingType
          (FSE_repeat *repeatMode,uint *count,uint max,size_t mostFrequent,size_t nbSeq,uint FSELog,
          FSE_CTable *prevCTable,short *defaultNorm,U32 defaultNormLog,
          ZSTD_defaultPolicy_e isDefaultAllowed,ZSTD_strategy strategy)

{
  bool bVar1;
  symbolEncodingType_e sVar2;
  uint uVar3;
  size_t sVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  size_t sVar9;
  BYTE wksp [512];
  ulong local_2b0;
  short local_2a8 [56];
  undefined1 local_238 [520];
  
  if (mostFrequent == nbSeq) {
    *repeatMode = FSE_repeat_none;
    return (uint)(2 < nbSeq || isDefaultAllowed == ZSTD_defaultDisallowed);
  }
  if ((int)strategy < 4) {
    if (isDefaultAllowed == ZSTD_defaultDisallowed) goto LAB_0010c38c;
    if (1 < defaultNormLog - 5) {
      __assert_fail("defaultNormLog >= 5 && defaultNormLog <= 6",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x244a,
                    "symbolEncodingType_e ZSTD_selectEncodingType(FSE_repeat *, const unsigned int *, const unsigned int, const size_t, size_t, const unsigned int, const FSE_CTable *, const short *, U32, const ZSTD_defaultPolicy_e, const ZSTD_strategy)"
                   );
    }
    if (9 < 10 - strategy) {
      __assert_fail("mult <= 9 && mult >= 7",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x244b,
                    "symbolEncodingType_e ZSTD_selectEncodingType(FSE_repeat *, const unsigned int *, const unsigned int, const size_t, size_t, const unsigned int, const FSE_CTable *, const short *, U32, const ZSTD_defaultPolicy_e, const ZSTD_strategy)"
                   );
    }
    if ((999 < nbSeq) || (*repeatMode != FSE_repeat_valid)) {
      if ((((ulong)(10 - strategy) << ((byte)defaultNormLog & 0x3f)) >> 3 <= nbSeq) &&
         (nbSeq >> ((byte)defaultNormLog - 1 & 0x3f) <= mostFrequent)) goto LAB_0010c373;
      goto LAB_0010c367;
    }
    bVar1 = false;
    sVar2 = set_repeat;
  }
  else {
    local_2b0 = 0xffffffffffffffff;
    sVar9 = 0xffffffffffffffff;
    if (isDefaultAllowed != ZSTD_defaultDisallowed) {
      sVar9 = ZSTD_crossEntropyCost(defaultNorm,defaultNormLog,count,max);
    }
    if (*repeatMode != FSE_repeat_none) {
      local_2b0 = ZSTD_fseBitCost(prevCTable,count,max);
    }
    uVar3 = FSE_optimalTableLog_internal(FSELog,nbSeq,max,2);
    sVar4 = FSE_normalizeCount(local_2a8,uVar3,count,nbSeq,max);
    if (sVar4 < 0xffffffffffffff89) {
      sVar4 = FSE_writeNCount(local_238,0x200,local_2a8,max,uVar3);
    }
    uVar7 = 0;
    uVar3 = 0;
    do {
      uVar8 = count[uVar7];
      if (nbSeq <= uVar8) {
        __assert_fail("count[s] < total",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x23ef,
                      "size_t ZSTD_entropyCost(const unsigned int *, const unsigned int, const size_t)"
                     );
      }
      uVar5 = (uVar8 << 8) / nbSeq;
      uVar6 = uVar5;
      if (uVar8 << 8 < nbSeq) {
        uVar6 = 1;
      }
      if (uVar8 == 0) {
        uVar6 = uVar5;
      }
      uVar3 = uVar3 + uVar8 * kInverseProbabilityLog256[uVar6];
      uVar8 = (int)uVar7 + 1;
      uVar7 = (ulong)uVar8;
    } while (uVar8 <= max);
    mostFrequent = (size_t)isDefaultAllowed;
    if (isDefaultAllowed != ZSTD_defaultDisallowed) {
      if (0xffffffffffffff88 < sVar9) {
        __assert_fail("!ZSTD_isError(basicCost)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x2465,
                      "symbolEncodingType_e ZSTD_selectEncodingType(FSE_repeat *, const unsigned int *, const unsigned int, const size_t, size_t, const unsigned int, const FSE_CTable *, const short *, U32, const ZSTD_defaultPolicy_e, const ZSTD_strategy)"
                     );
      }
      if ((0xffffffffffffff88 < local_2b0) && (*repeatMode == FSE_repeat_valid)) {
        __assert_fail("!(*repeatMode == FSE_repeat_valid && ZSTD_isError(repeatCost))",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x2466,
                      "symbolEncodingType_e ZSTD_selectEncodingType(FSE_repeat *, const unsigned int *, const unsigned int, const size_t, size_t, const unsigned int, const FSE_CTable *, const short *, U32, const ZSTD_defaultPolicy_e, const ZSTD_strategy)"
                     );
      }
    }
    if (0xffffffffffffff88 < sVar4) {
      __assert_fail("!ZSTD_isError(NCountCost)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x2468,
                    "symbolEncodingType_e ZSTD_selectEncodingType(FSE_repeat *, const unsigned int *, const unsigned int, const size_t, size_t, const unsigned int, const FSE_CTable *, const short *, U32, const ZSTD_defaultPolicy_e, const ZSTD_strategy)"
                   );
    }
    uVar7 = sVar4 * 8 + (ulong)(uVar3 >> 8);
    if (0xffffffffffffff87 < uVar7) {
      __assert_fail("compressedCost < ERROR(maxCode)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x2469,
                    "symbolEncodingType_e ZSTD_selectEncodingType(FSE_repeat *, const unsigned int *, const unsigned int, const size_t, size_t, const unsigned int, const FSE_CTable *, const short *, U32, const ZSTD_defaultPolicy_e, const ZSTD_strategy)"
                   );
    }
    if ((local_2b0 < sVar9) || (uVar7 < sVar9)) {
      if (uVar7 < local_2b0) {
        if (sVar9 <= uVar7) {
          __assert_fail("compressedCost < basicCost && compressedCost < repeatCost",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x2477,
                        "symbolEncodingType_e ZSTD_selectEncodingType(FSE_repeat *, const unsigned int *, const unsigned int, const size_t, size_t, const unsigned int, const FSE_CTable *, const short *, U32, const ZSTD_defaultPolicy_e, const ZSTD_strategy)"
                       );
        }
LAB_0010c373:
        sVar2 = (symbolEncodingType_e)mostFrequent;
        bVar1 = true;
      }
      else {
        if (0xffffffffffffff88 < local_2b0) {
          __assert_fail("!ZSTD_isError(repeatCost)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x2474,
                        "symbolEncodingType_e ZSTD_selectEncodingType(FSE_repeat *, const unsigned int *, const unsigned int, const size_t, size_t, const unsigned int, const FSE_CTable *, const short *, U32, const ZSTD_defaultPolicy_e, const ZSTD_strategy)"
                       );
        }
        sVar2 = set_repeat;
        bVar1 = false;
      }
    }
    else {
      if (isDefaultAllowed == ZSTD_defaultDisallowed) {
        __assert_fail("isDefaultAllowed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x246e,
                      "symbolEncodingType_e ZSTD_selectEncodingType(FSE_repeat *, const unsigned int *, const unsigned int, const size_t, size_t, const unsigned int, const FSE_CTable *, const short *, U32, const ZSTD_defaultPolicy_e, const ZSTD_strategy)"
                     );
      }
LAB_0010c367:
      *repeatMode = FSE_repeat_none;
      bVar1 = false;
      sVar2 = set_basic;
    }
  }
  if (!bVar1) {
    return sVar2;
  }
LAB_0010c38c:
  *repeatMode = FSE_repeat_check;
  return set_compressed;
}

Assistant:

symbolEncodingType_e
ZSTD_selectEncodingType(
        FSE_repeat* repeatMode, unsigned const* count, unsigned const max,
        size_t const mostFrequent, size_t nbSeq, unsigned const FSELog,
        FSE_CTable const* prevCTable,
        short const* defaultNorm, U32 defaultNormLog,
        ZSTD_defaultPolicy_e const isDefaultAllowed,
        ZSTD_strategy const strategy)
{
    ZSTD_STATIC_ASSERT(ZSTD_defaultDisallowed == 0 && ZSTD_defaultAllowed != 0);
    if (mostFrequent == nbSeq) {
        *repeatMode = FSE_repeat_none;
        if (isDefaultAllowed && nbSeq <= 2) {
            /* Prefer set_basic over set_rle when there are 2 or less symbols,
             * since RLE uses 1 byte, but set_basic uses 5-6 bits per symbol.
             * If basic encoding isn't possible, always choose RLE.
             */
            DEBUGLOG(5, "Selected set_basic");
            return set_basic;
        }
        DEBUGLOG(5, "Selected set_rle");
        return set_rle;
    }
    if (strategy < ZSTD_lazy) {
        if (isDefaultAllowed) {
            size_t const staticFse_nbSeq_max = 1000;
            size_t const mult = 10 - strategy;
            size_t const baseLog = 3;
            size_t const dynamicFse_nbSeq_min = (((size_t)1 << defaultNormLog) * mult) >> baseLog;  /* 28-36 for offset, 56-72 for lengths */
            assert(defaultNormLog >= 5 && defaultNormLog <= 6);  /* xx_DEFAULTNORMLOG */
            assert(mult <= 9 && mult >= 7);
            if ( (*repeatMode == FSE_repeat_valid)
              && (nbSeq < staticFse_nbSeq_max) ) {
                DEBUGLOG(5, "Selected set_repeat");
                return set_repeat;
            }
            if ( (nbSeq < dynamicFse_nbSeq_min)
              || (mostFrequent < (nbSeq >> (defaultNormLog-1))) ) {
                DEBUGLOG(5, "Selected set_basic");
                /* The format allows default tables to be repeated, but it isn't useful.
                 * When using simple heuristics to select encoding type, we don't want
                 * to confuse these tables with dictionaries. When running more careful
                 * analysis, we don't need to waste time checking both repeating tables
                 * and default tables.
                 */
                *repeatMode = FSE_repeat_none;
                return set_basic;
            }
        }
    } else {
        size_t const basicCost = isDefaultAllowed ? ZSTD_crossEntropyCost(defaultNorm, defaultNormLog, count, max) : ERROR(GENERIC);
        size_t const repeatCost = *repeatMode != FSE_repeat_none ? ZSTD_fseBitCost(prevCTable, count, max) : ERROR(GENERIC);
        size_t const NCountCost = ZSTD_NCountCost(count, max, nbSeq, FSELog);
        size_t const compressedCost = (NCountCost << 3) + ZSTD_entropyCost(count, max, nbSeq);

        if (isDefaultAllowed) {
            assert(!ZSTD_isError(basicCost));
            assert(!(*repeatMode == FSE_repeat_valid && ZSTD_isError(repeatCost)));
        }
        assert(!ZSTD_isError(NCountCost));
        assert(compressedCost < ERROR(maxCode));
        DEBUGLOG(5, "Estimated bit costs: basic=%u\trepeat=%u\tcompressed=%u",
                    (unsigned)basicCost, (unsigned)repeatCost, (unsigned)compressedCost);
        if (basicCost <= repeatCost && basicCost <= compressedCost) {
            DEBUGLOG(5, "Selected set_basic");
            assert(isDefaultAllowed);
            *repeatMode = FSE_repeat_none;
            return set_basic;
        }
        if (repeatCost <= compressedCost) {
            DEBUGLOG(5, "Selected set_repeat");
            assert(!ZSTD_isError(repeatCost));
            return set_repeat;
        }
        assert(compressedCost < basicCost && compressedCost < repeatCost);
    }
    DEBUGLOG(5, "Selected set_compressed");
    *repeatMode = FSE_repeat_check;
    return set_compressed;
}